

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::ReadStructure(BVHLoader *this,aiScene *pScene)

{
  bool bVar1;
  char *pcVar2;
  string motion;
  string header;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  GetNextToken_abi_cxx11_(&local_38,this);
  bVar1 = std::operator!=(&local_38,"HIERARCHY");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Expected header string \"HIERARCHY\".",
               (allocator<char> *)&local_58);
    ThrowException(this,&local_78);
  }
  ReadHierarchy(this,pScene);
  GetNextToken_abi_cxx11_(&local_78,this);
  pcVar2 = "MOTION";
  bVar1 = std::operator!=(&local_78,"MOTION");
  if (!bVar1) {
    ReadMotion(this,(aiScene *)pcVar2);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Expected beginning of motion data \"MOTION\".",&local_79);
  ThrowException(this,&local_58);
}

Assistant:

void BVHLoader::ReadStructure( aiScene* pScene)
{
    // first comes hierarchy
    std::string header = GetNextToken();
    if( header != "HIERARCHY")
        ThrowException( "Expected header string \"HIERARCHY\".");
    ReadHierarchy( pScene);

    // then comes the motion data
    std::string motion = GetNextToken();
    if( motion != "MOTION")
        ThrowException( "Expected beginning of motion data \"MOTION\".");
    ReadMotion( pScene);
}